

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Remove_Module(FT_Library library,FT_Module module)

{
  FT_Module *ppFVar1;
  FT_Module *limit;
  FT_Module *cur;
  FT_Module module_local;
  FT_Library library_local;
  
  if (library == (FT_Library)0x0) {
    library_local._4_4_ = 0x21;
  }
  else {
    if (module != (FT_Module)0x0) {
      limit = library->modules;
      ppFVar1 = limit + library->num_modules;
      for (; limit < ppFVar1; limit = limit + 1) {
        if (*limit == module) {
          library->num_modules = library->num_modules - 1;
          for (; limit < ppFVar1 + -1; limit = limit + 1) {
            *limit = limit[1];
          }
          ppFVar1[-1] = (FT_Module)0x0;
          Destroy_Module(module);
          return 0;
        }
      }
    }
    library_local._4_4_ = 0x22;
  }
  return library_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Remove_Module( FT_Library  library,
                    FT_Module   module )
  {
    /* try to find the module from the table, then remove it from there */

    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( module )
    {
      FT_Module*  cur   = library->modules;
      FT_Module*  limit = cur + library->num_modules;


      for ( ; cur < limit; cur++ )
      {
        if ( cur[0] == module )
        {
          /* remove it from the table */
          library->num_modules--;
          limit--;
          while ( cur < limit )
          {
            cur[0] = cur[1];
            cur++;
          }
          limit[0] = NULL;

          /* destroy the module */
          Destroy_Module( module );

          return FT_Err_Ok;
        }
      }
    }
    return FT_THROW( Invalid_Driver_Handle );
  }